

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O1

int lj_cf_buffer_method_putcdata(lua_State *L)

{
  TValue *pTVar1;
  CTState *cts;
  MSize len;
  SBufExt *sb;
  char *p;
  void *local_20;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)((uint)(sb->L).ptr64 & 7) | (ulong)L;
  pTVar1 = L->base;
  if (pTVar1[1].field_4.it >> 0xf == 0x1fff5) {
    cts = *(CTState **)((L->glref).ptr64 + 0x180);
    cts->L = L;
    lj_cconv_ct_tv(cts,cts->tab + 0x12,(uint8_t *)&local_20,pTVar1 + 1,0x200);
    len = lj_lib_checkintrange(L,3,0,0x7fffff00);
    lj_buf_putmem((SBuf *)sb,local_20,len);
    L->top = L->base + 1;
    return 1;
  }
  lj_err_argtype(L,2,"cdata");
}

Assistant:

LJLIB_CF(buffer_method_putcdata)	LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  const char *p;
  MSize len;
  if (tviscdata(L->base+1)) {
    CTState *cts = ctype_cts(L);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p,
		   L->base+1, CCF_ARG(2));
  } else {
    lj_err_argtype(L, 2, "cdata");
  }
  len = (MSize)lj_lib_checkintrange(L, 3, 0, LJ_MAX_BUF);
  lj_buf_putmem((SBuf *)sbx, p, len);
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}